

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5TokendataIterAppendMap
               (Fts5Index *p,Fts5TokenDataIter *pT,int iIter,int nByte,i64 iRowid,i64 iPos)

{
  void *pvVar1;
  undefined4 in_ECX;
  undefined4 in_EDX;
  int *in_RSI;
  long in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  Fts5TokenDataMap *aNew;
  int nAlloc;
  int nNew;
  void *in_stack_ffffffffffffffb8;
  int local_3c;
  
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if (in_RSI[1] == *in_RSI) {
      if (*in_RSI == 0) {
        local_3c = 0x40;
      }
      else {
        local_3c = *in_RSI << 1;
      }
      pvVar1 = sqlite3_realloc(in_stack_ffffffffffffffb8,0);
      if (pvVar1 == (void *)0x0) {
        *(undefined4 *)(in_RDI + 0x3c) = 7;
        return;
      }
      *(void **)(in_RSI + 2) = pvVar1;
      *in_RSI = local_3c;
    }
    *(undefined8 *)(*(long *)(in_RSI + 2) + (long)in_RSI[1] * 0x18) = in_R8;
    *(undefined8 *)(*(long *)(in_RSI + 2) + (long)in_RSI[1] * 0x18 + 8) = in_R9;
    *(undefined4 *)(*(long *)(in_RSI + 2) + (long)in_RSI[1] * 0x18 + 0x10) = in_EDX;
    *(undefined4 *)(*(long *)(in_RSI + 2) + (long)in_RSI[1] * 0x18 + 0x14) = in_ECX;
    in_RSI[1] = in_RSI[1] + 1;
  }
  return;
}

Assistant:

static void fts5TokendataIterAppendMap(
  Fts5Index *p,
  Fts5TokenDataIter *pT,
  int iIter,
  int nByte,
  i64 iRowid,
  i64 iPos
){
  if( p->rc==SQLITE_OK ){
    if( pT->nMap==pT->nMapAlloc ){
      int nNew = pT->nMapAlloc ? pT->nMapAlloc*2 : 64;
      int nAlloc = nNew * sizeof(Fts5TokenDataMap);
      Fts5TokenDataMap *aNew;

      aNew = (Fts5TokenDataMap*)sqlite3_realloc(pT->aMap, nAlloc);
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        return;
      }

      pT->aMap = aNew;
      pT->nMapAlloc = nNew;
    }

    pT->aMap[pT->nMap].iRowid = iRowid;
    pT->aMap[pT->nMap].iPos = iPos;
    pT->aMap[pT->nMap].iIter = iIter;
    pT->aMap[pT->nMap].nByte = nByte;
    pT->nMap++;
  }
}